

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,true>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  ulong uVar1;
  unsigned_long *puVar2;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t left_01;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  hugeint_t hVar12;
  uint64_t in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffb0;
  idx_t iVar13;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar7 = 8;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      left_01.upper = in_stack_ffffffffffffffb0;
      left_01.lower = (uint64_t)result_data;
      hVar12.upper = in_stack_ffffffffffffffa0;
      hVar12.lower = in_stack_ffffffffffffff98;
      hVar12 = BitwiseXOROperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                         (left_01,hVar12);
      *(uint64_t *)((long)result_data + lVar7 + -8) = hVar12.lower;
      *(int64_t *)((long)&result_data->lower + lVar7) = hVar12.upper;
      lVar7 = lVar7 + 0x10;
    }
  }
  else {
    uVar1 = count + 0x3f;
    uVar8 = 0;
    iVar13 = count;
    for (uVar4 = 0; uVar4 != uVar1 >> 6; uVar4 = uVar4 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_00d3a2c2:
        uVar5 = uVar8 << 4 | 8;
        for (; uVar3 = uVar8, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          left.upper = iVar13;
          left.lower = (uint64_t)result_data;
          right.upper = uVar4;
          right.lower = in_stack_ffffffffffffff98;
          hVar12 = BitwiseXOROperator::
                   Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(left,right);
          *(uint64_t *)((long)result_data + (uVar5 - 8)) = hVar12.lower;
          *(int64_t *)((long)&result_data->lower + uVar5) = hVar12.upper;
          uVar5 = uVar5 + 0x10;
        }
      }
      else {
        uVar5 = puVar2[uVar4];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_00d3a2c2;
        uVar3 = uVar9;
        if (uVar5 != 0) {
          uVar6 = uVar8 << 4 | 8;
          count = iVar13;
          for (uVar10 = 0; uVar3 = uVar10 + uVar8, iVar13 = count, uVar10 + uVar8 < uVar9;
              uVar10 = uVar10 + 1) {
            if ((uVar5 >> (uVar10 & 0x3f) & 1) != 0) {
              left_00.upper = count;
              left_00.lower = (uint64_t)result_data;
              right_00.upper = uVar4;
              right_00.lower = in_stack_ffffffffffffff98;
              hVar12 = BitwiseXOROperator::
                       Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                 (left_00,right_00);
              *(uint64_t *)((long)result_data + (uVar6 - 8)) = hVar12.lower;
              *(int64_t *)((long)&result_data->lower + uVar6) = hVar12.upper;
            }
            uVar6 = uVar6 + 0x10;
          }
        }
      }
      uVar8 = uVar3;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}